

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Compiler.cpp
# Opt level: O3

void __thiscall soul::Compiler::addDefaultBuiltInLibrary(Compiler *this)

{
  long in_FS_OFFSET;
  string_view moduleName;
  string_view moduleName_00;
  string_view moduleName_01;
  string_view moduleName_02;
  string_view moduleName_03;
  string_view moduleName_04;
  string_view moduleName_05;
  string_view moduleName_06;
  string_view moduleName_07;
  CompileMessageHandler handler;
  CompileMessageList list;
  CodeLocation local_130;
  CodeLocation local_120;
  CodeLocation local_110;
  CodeLocation local_100;
  CodeLocation local_f0;
  CodeLocation local_e0;
  CodeLocation local_d0;
  CodeLocation local_c0;
  CodeLocation local_b0;
  CodeLocation local_a0;
  _Any_data local_90;
  code *local_80;
  code *local_78;
  undefined8 local_70;
  _Any_data local_48;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  
  local_90._M_unused._M_object = &local_48;
  local_28 = 0;
  uStack_20 = 0;
  local_38 = 0;
  uStack_30 = 0;
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  local_18 = 0;
  local_78 = std::
             _Function_handler<void_(const_soul::CompileMessageGroup_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonhochrein[P]soul-lsp/vendor/SOUL/source/modules/soul_core/diagnostics/soul_CompileMessageList.cpp:200:30)>
             ::_M_invoke;
  local_90._8_8_ = 0;
  local_80 = std::
             _Function_handler<void_(const_soul::CompileMessageGroup_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonhochrein[P]soul-lsp/vendor/SOUL/source/modules/soul_core/diagnostics/soul_CompileMessageList.cpp:200:30)>
             ::_M_manager;
  local_70 = *(undefined8 *)(in_FS_OFFSET + -8);
  *(_Any_data **)(in_FS_OFFSET + -8) = &local_90;
  getDefaultLibraryCode();
  compile(this,&local_a0);
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_a0.sourceCode.object);
  moduleName._M_str = (char *)0x10;
  moduleName._M_len = (size_t)&local_b0;
  getSystemModule(moduleName);
  compile(this,&local_b0);
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_b0.sourceCode.object);
  moduleName_00._M_str = (char *)0x9;
  moduleName_00._M_len = (size_t)&local_c0;
  getSystemModule(moduleName_00);
  compile(this,&local_c0);
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_c0.sourceCode.object);
  moduleName_01._M_str = (char *)0xa;
  moduleName_01._M_len = (size_t)&local_d0;
  getSystemModule(moduleName_01);
  compile(this,&local_d0);
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_d0.sourceCode.object);
  moduleName_02._M_str = (char *)0xe;
  moduleName_02._M_len = (size_t)&local_e0;
  getSystemModule(moduleName_02);
  compile(this,&local_e0);
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_e0.sourceCode.object);
  moduleName_03._M_str = (char *)0xb;
  moduleName_03._M_len = (size_t)&local_f0;
  getSystemModule(moduleName_03);
  compile(this,&local_f0);
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_f0.sourceCode.object);
  moduleName_04._M_str = (char *)0x10;
  moduleName_04._M_len = (size_t)&local_100;
  getSystemModule(moduleName_04);
  compile(this,&local_100);
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_100.sourceCode.object);
  moduleName_05._M_str = (char *)0xa;
  moduleName_05._M_len = (size_t)&local_110;
  getSystemModule(moduleName_05);
  compile(this,&local_110);
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_110.sourceCode.object);
  moduleName_06._M_str = (char *)0xd;
  moduleName_06._M_len = (size_t)&local_120;
  getSystemModule(moduleName_06);
  compile(this,&local_120);
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_120.sourceCode.object);
  moduleName_07._M_str = (char *)0xc;
  moduleName_07._M_len = (size_t)&local_130;
  getSystemModule(moduleName_07);
  compile(this,&local_130);
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_130.sourceCode.object);
  CompileMessageHandler::~CompileMessageHandler((CompileMessageHandler *)&local_90);
  CompileMessageList::~CompileMessageList((CompileMessageList *)&local_48);
  return;
}

Assistant:

void Compiler::addDefaultBuiltInLibrary()
{
    CompileMessageList list;

    try
    {
        soul::CompileMessageHandler handler (list);
        compile (getDefaultLibraryCode());

        // TODO: when we have import & module support, these will no longer be hard-coded here
        compile (getSystemModule ("soul.audio.utils"));
        compile (getSystemModule ("soul.midi"));
        compile (getSystemModule ("soul.notes"));
        compile (getSystemModule ("soul.frequency"));
        compile (getSystemModule ("soul.mixing"));
        compile (getSystemModule ("soul.oscillators"));
        compile (getSystemModule ("soul.noise"));
        compile (getSystemModule ("soul.timeline"));
        compile (getSystemModule ("soul.filters"));
    }
    catch (soul::AbortCompilationException)
    {
        soul::throwInternalCompilerError ("Error in built-in code: " + list.toString());
    }
}